

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O0

bool __thiscall
CheckDatasetsExistence::operator()
          (CheckDatasetsExistence *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataset,bool print_message)

{
  path *lhs;
  OutputBox *this_00;
  bool bVar1;
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  path local_d0;
  path local_a0;
  path local_80;
  undefined1 local_60 [8];
  path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool exists_one_dataset;
  bool print_message_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dataset_local;
  CheckDatasetsExistence *this_local;
  
  __range1._6_1_ = false;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(dataset);
  x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(dataset);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&x), bVar1) {
    p._24_8_ = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    lhs = this->input_path_;
    filesystem::path::path(&local_a0,(string *)p._24_8_);
    filesystem::operator/(&local_80,lhs,&local_a0);
    filesystem::path::path(&local_d0,this->input_txt_);
    filesystem::operator/((path *)local_60,&local_80,&local_d0);
    filesystem::path::~path(&local_d0);
    filesystem::path::~path(&local_80);
    filesystem::path::~path(&local_a0);
    bVar1 = filesystem::exists((path *)local_60,this->ec_);
    if (bVar1) {
      __range1._6_1_ = true;
    }
    else if (print_message) {
      this_00 = this->ob_;
      std::operator+((char *)local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "There is no dataset \'");
      std::operator+(local_f0,(char *)local_110);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"",&local_131);
      OutputBox::Cwarning(this_00,local_f0,(string *)local_130);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string(local_110);
    }
    filesystem::path::~path((path *)local_60);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._6_1_;
}

Assistant:

bool operator()(const std::vector<cv::String>& dataset, bool print_message) {
        // Check if all the datasets' files.txt exist
        bool exists_one_dataset = false;
        for (auto& x : dataset) {
            path p = input_path_ / path(x) / path(input_txt_);
            if (!exists(p, ec_)) {
                if (print_message) {
                    ob_.Cwarning("There is no dataset '" + x + "' (no files.txt available), skipped");
                }
            }
            else {
                exists_one_dataset = true;
            }
        }
        return exists_one_dataset;
    }